

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-1123_converter.h
# Opt level: O3

bool date::date_converter<date::rfc1123,_long,_void>::to_parts(time_t timepoint,parts *parts)

{
  undefined8 in_RAX;
  seconds_count sVar1;
  date_time dVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  date_time local_18;
  
  local_18._7_1_ = SUB81((ulong)in_RAX >> 0x38,0);
  local_18.super_date.year = 0x7b2;
  local_18.super_date.month = '\x01';
  local_18.super_date.day = '\x01';
  local_18.super_time.hour = '\0';
  local_18.super_time.minute = '\0';
  local_18.super_time.second = '\0';
  sVar1 = calendar_helper::to_seconds_count(&local_18);
  dVar2 = calendar_helper::from_seconds_count(timepoint + sVar1);
  parts->year = dVar2.super_date.year;
  uVar6 = dVar2._2_4_ & 0xff;
  bVar4 = dVar2.super_date.month;
  uVar7 = uVar6 + 0xc;
  if (bVar4 >= 3) {
    uVar7 = uVar6;
  }
  parts->month = bVar4;
  iVar8 = ((uint)dVar2.super_date & 0xffff) - (uint)(bVar4 < 3);
  parts->day = dVar2.super_date.day;
  iVar3 = (int)(uVar7 * 0x99 + -0x1c9) / 5;
  iVar5 = iVar8 + 3;
  if (-1 < iVar8) {
    iVar5 = iVar8;
  }
  iVar9 = (int)((ulong)((long)iVar8 * -0x51eb851f) >> 0x20);
  iVar5 = iVar8 * 0x16d + (dVar2._3_4_ & 0xff) + (iVar5 >> 2) + ((iVar9 >> 5) - (iVar9 >> 0x1f)) +
          iVar8 / 400;
  iVar8 = iVar5 + iVar3;
  iVar3 = (int)((ulong)((long)(iVar5 + iVar3 + 1) * -0x6db6db6d) >> 0x20) + iVar8 + 1;
  parts->week_day = ((char)(iVar3 >> 2) - (char)(iVar3 >> 0x1f)) * -7 + (char)iVar8 + '\x02';
  parts->hour = dVar2.super_time.hour;
  parts->minute = dVar2.super_time.minute;
  parts->second = dVar2.super_time.second;
  parts->offset_in_minutes = 0;
  return true;
}

Assistant:

static bool to_parts(std::time_t timepoint, rfc1123::parts& parts)
    {
        using date_time = calendar_helper::date_time;
        const auto epoch_offset = calendar_helper::to_seconds_count(date_time{ 1970, 1, 1, 0, 0, 0 });
        const auto dt = calendar_helper::from_seconds_count(epoch_offset + timepoint);
        parts.year     = dt.year;
        parts.month    = dt.month;
        parts.day      = dt.day;
        parts.week_day = calendar_helper::day_of_week(dt);
        parts.hour     = dt.hour;
        parts.minute   = dt.minute;
        parts.second   = dt.second;
        parts.offset_in_minutes = 0;
        return true;
    }